

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-netpack.c
# Opt level: O0

int lclear(lua_State *L)

{
  int *piVar1;
  netpack *np;
  int i;
  queue *q;
  lua_State *L_local;
  
  piVar1 = (int *)lua_touserdata(L,1);
  if (piVar1 != (int *)0x0) {
    for (np._4_4_ = 0; np._4_4_ < 0x1000; np._4_4_ = np._4_4_ + 1) {
      clear_list(*(uncomplete **)(piVar1 + (long)np._4_4_ * 2 + 4));
      (piVar1 + (long)np._4_4_ * 2 + 4)[0] = 0;
      (piVar1 + (long)np._4_4_ * 2 + 4)[1] = 0;
    }
    if (piVar1[2] < piVar1[1]) {
      piVar1[2] = *piVar1 + piVar1[2];
    }
    for (np._4_4_ = piVar1[1]; np._4_4_ < piVar1[2]; np._4_4_ = np._4_4_ + 1) {
      free(*(void **)(piVar1 + (long)(np._4_4_ % *piVar1) * 4 + 0x2006));
    }
    piVar1[2] = 0;
    piVar1[1] = 0;
  }
  return 0;
}

Assistant:

static int
lclear(lua_State *L) {
	struct queue * q = lua_touserdata(L, 1);
	if (q == NULL) {
		return 0;
	}
	int i;
	for (i=0;i<HASHSIZE;i++) {
		clear_list(q->hash[i]);
		q->hash[i] = NULL;
	}
	if (q->head > q->tail) {
		q->tail += q->cap;
	}
	for (i=q->head;i<q->tail;i++) {
		struct netpack *np = &q->queue[i % q->cap];
		skynet_free(np->buffer);
	}
	q->head = q->tail = 0;

	return 0;
}